

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

NamedTextures * __thiscall
pbrt::ParsedScene::CreateTextures
          (NamedTextures *__return_storage_ptr__,ParsedScene *this,Allocator alloc,bool gpu)

{
  FileLoc *loc;
  ParameterDictionary *dict;
  unsigned_long uVar1;
  pointer ppVar2;
  int iVar3;
  string *name;
  TextureSceneEntity *pTVar4;
  pointer puVar5;
  bool bVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  TVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  pointer ppVar12;
  pointer puVar13;
  pointer puVar14;
  bool gpu_local;
  allocator<char> local_291;
  SpectrumTextureHandle unboundedTex;
  int nMissingTextures;
  Allocator alloc_local;
  SpectrumTextureHandle illumTex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> serialSpectrumTextures;
  vector<unsigned_long,_std::allocator<unsigned_long>_> parallelSpectrumTextures;
  vector<unsigned_long,_std::allocator<unsigned_long>_> serialFloatTextures;
  vector<unsigned_long,_std::allocator<unsigned_long>_> parallelFloatTextures;
  FloatTextureHandle t;
  mutex mutex;
  TextureParameterDictionary texDict;
  _Any_data local_158;
  code *pcStack_148;
  code *pcStack_140;
  _Any_data local_138;
  code *pcStack_128;
  code *pcStack_120;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seenSpectrumTextureFilenames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seenFloatTextureFilenames;
  string filename;
  
  gpu_local = gpu;
  alloc_local = alloc;
  NamedTextures::NamedTextures(__return_storage_ptr__);
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header;
  parallelSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serialSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nMissingTextures = 0;
  iVar3 = 0;
  TVar10.bits = 0;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parallelFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parallelFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parallelFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parallelSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  parallelSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  serialSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serialSpectrumTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  serialFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serialFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serialFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    ppVar12 = (this->floatTextures).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->floatTextures).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar12) / 0x398) <=
        TVar10.bits) break;
    unboundedTex.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               )TVar10.bits;
    if (*(bool *)((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.renderFromObject +
                 0x108) == true) {
      Warning((FileLoc *)
              ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.super_SceneEntity +
              0x88),"Animated world to texture transforms are not supported. Using start transform."
             );
    }
    bVar6 = std::operator!=(&ppVar12[TVar10.bits].second.texName,"imagemap");
    if (bVar6) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&serialFloatTextures,(value_type_conflict5 *)&unboundedTex);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texDict,"filename",(allocator<char> *)&illumTex);
      std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",&local_291);
      ParameterDictionary::GetOneString
                ((string *)&mutex,
                 (ParameterDictionary *)
                 ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.super_SceneEntity
                 + 0x20),(string *)&texDict,(string *)&t);
      ResolveFilename(&filename,(string *)&mutex);
      std::__cxx11::string::~string((string *)&mutex);
      std::__cxx11::string::~string((string *)&t);
      std::__cxx11::string::~string((string *)&texDict);
      if (filename._M_string_length != 0) {
        bVar6 = FileExists(&filename);
        if (!bVar6) {
          Error<std::__cxx11::string&>
                    ((FileLoc *)
                     ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.
                             super_SceneEntity + 0x88),"%s: file not found.",&filename);
          nMissingTextures = iVar3 + 1;
          iVar3 = nMissingTextures;
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&seenFloatTextureFilenames._M_t,&filename);
        pvVar11 = &serialFloatTextures;
        if ((_Rb_tree_header *)iVar7._M_node ==
            &seenFloatTextureFilenames._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&seenFloatTextureFilenames,&filename);
          pvVar11 = &parallelFloatTextures;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar11,(value_type_conflict5 *)&unboundedTex);
      }
      std::__cxx11::string::~string((string *)&filename);
    }
    TVar10 = unboundedTex.
             super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits + 1;
  }
  TVar10.bits = 0;
  while( true ) {
    ppVar12 = (this->spectrumTextures).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    unboundedTex.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               )TVar10.bits;
    if ((ulong)(((long)(this->spectrumTextures).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar12) / 0x398) <=
        TVar10.bits) break;
    if (*(bool *)((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.renderFromObject +
                 0x108) == true) {
      Warning((FileLoc *)
              ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.super_SceneEntity +
              0x88),"Animated world to texture transforms are not supported. Using start transform."
             );
    }
    bVar6 = std::operator!=(&ppVar12[TVar10.bits].second.texName,"imagemap");
    if (bVar6) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&serialSpectrumTextures,(value_type_conflict5 *)&unboundedTex);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texDict,"filename",(allocator<char> *)&illumTex);
      std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",&local_291);
      ParameterDictionary::GetOneString
                ((string *)&mutex,
                 (ParameterDictionary *)
                 ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.super_SceneEntity
                 + 0x20),(string *)&texDict,(string *)&t);
      ResolveFilename(&filename,(string *)&mutex);
      std::__cxx11::string::~string((string *)&mutex);
      std::__cxx11::string::~string((string *)&t);
      std::__cxx11::string::~string((string *)&texDict);
      if (filename._M_string_length != 0) {
        bVar6 = FileExists(&filename);
        if (!bVar6) {
          Error<std::__cxx11::string&>
                    ((FileLoc *)
                     ((long)&ppVar12[TVar10.bits].second.super_TransformedSceneEntity.
                             super_SceneEntity + 0x88),"%s: file not found.",&filename);
          nMissingTextures = iVar3 + 1;
          iVar3 = nMissingTextures;
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&seenSpectrumTextureFilenames._M_t,&filename);
        pvVar11 = &serialSpectrumTextures;
        if ((_Rb_tree_header *)iVar7._M_node ==
            &seenSpectrumTextureFilenames._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&seenSpectrumTextureFilenames,&filename);
          pvVar11 = &parallelSpectrumTextures;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar11,(value_type_conflict5 *)&unboundedTex);
      }
      std::__cxx11::string::~string((string *)&filename);
    }
    TVar10 = unboundedTex.
             super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits + 1;
  }
  if (iVar3 < 1) {
    if (LOGGING_LogLevel < 1) {
      mutex.super___mutex_base._M_mutex.__align =
           (long)parallelSpectrumTextures.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)parallelSpectrumTextures.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      filename._M_dataplus._M_p =
           (pointer)((long)parallelFloatTextures.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)parallelFloatTextures.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
      texDict.dict = (ParameterDictionary *)
                     ((long)serialFloatTextures.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)serialFloatTextures.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      t.
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               )((long)serialSpectrumTextures.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)serialSpectrumTextures.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      Log<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                 ,0x335,"Loading %d,%d textures in parallel, %d,%d serially",
                 (unsigned_long *)&filename,(unsigned_long *)&mutex,(unsigned_long *)&texDict,
                 (unsigned_long *)&t);
    }
    puVar13 = parallelFloatTextures.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar14 = parallelFloatTextures.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__align = 0;
    mutex.super___mutex_base._M_mutex._8_8_ = 0;
    mutex.super___mutex_base._M_mutex._16_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    pcStack_128 = (code *)0x0;
    pcStack_120 = (code *)0x0;
    local_138._M_unused._M_object = operator_new(0x30);
    *(ParsedScene **)local_138._M_unused._0_8_ = this;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)((long)local_138._M_unused._0_8_ + 8)
         = &parallelFloatTextures;
    *(Allocator **)((long)local_138._M_unused._0_8_ + 0x10) = &alloc_local;
    *(bool **)((long)local_138._M_unused._0_8_ + 0x18) = &gpu_local;
    *(mutex **)((long)local_138._M_unused._0_8_ + 0x20) = &mutex;
    *(NamedTextures **)((long)local_138._M_unused._0_8_ + 0x28) = __return_storage_ptr__;
    pcStack_120 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:826:50)>
                  ::_M_invoke;
    pcStack_128 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:826:50)>
                  ::_M_manager;
    ParallelFor(0,(long)puVar13 - (long)puVar14 >> 3,(function<void_(long)> *)&local_138);
    std::_Function_base::~_Function_base((_Function_base *)&local_138);
    puVar13 = parallelSpectrumTextures.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar14 = parallelSpectrumTextures.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    pcStack_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = operator_new(0x30);
    *(ParsedScene **)local_158._M_unused._0_8_ = this;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)((long)local_158._M_unused._0_8_ + 8)
         = &parallelSpectrumTextures;
    *(Allocator **)((long)local_158._M_unused._0_8_ + 0x10) = &alloc_local;
    *(bool **)((long)local_158._M_unused._0_8_ + 0x18) = &gpu_local;
    *(mutex **)((long)local_158._M_unused._0_8_ + 0x20) = &mutex;
    *(NamedTextures **)((long)local_158._M_unused._0_8_ + 0x28) = __return_storage_ptr__;
    pcStack_140 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:839:53)>
                  ::_M_invoke;
    pcStack_148 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:839:53)>
                  ::_M_manager;
    ParallelFor(0,(long)puVar13 - (long)puVar14 >> 3,(function<void_(long)> *)&local_158);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    if (LOGGING_LogLevel < 1) {
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
          ,0x35e,"Loading serial textures");
    }
    puVar14 = serialFloatTextures.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = serialFloatTextures.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        puVar5 = serialSpectrumTextures.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish, puVar13 != puVar14; puVar13 = puVar13 + 1) {
      uVar1 = *puVar13;
      ppVar12 = (this->floatTextures).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dict = (ParameterDictionary *)
             ((long)&ppVar12[uVar1].second.super_TransformedSceneEntity.super_SceneEntity + 0x20);
      filename._M_dataplus._M_p = (pointer)dict[1].params.field_2.fixed[1];
      filename._M_string_length = (size_type)dict[1].params.field_2.fixed[2];
      filename.field_2._M_allocated_capacity = (size_type)dict[1].params.field_2.fixed[3];
      filename.field_2._8_8_ = dict[1].params.field_2.fixed[4];
      TextureParameterDictionary::TextureParameterDictionary(&texDict,dict,__return_storage_ptr__);
      ppVar12 = ppVar12 + uVar1;
      FloatTextureHandle::Create
                (&t,&(ppVar12->second).texName,(Transform *)&filename,&texDict,
                 (FileLoc *)
                 ((long)&(ppVar12->second).super_TransformedSceneEntity.super_SceneEntity + 0x88),
                 alloc_local,gpu_local);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
               ::operator[](&__return_storage_ptr__->floatTextures,&ppVar12->first);
      (pmVar8->
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      ).bits = (uintptr_t)
               t.
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits;
    }
    for (puVar14 = serialSpectrumTextures.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar14 != puVar5; puVar14 = puVar14 + 1) {
      uVar1 = *puVar14;
      ppVar2 = (this->spectrumTextures).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar12 = ppVar2 + uVar1;
      if (*(bool *)((long)&ppVar2[uVar1].second.super_TransformedSceneEntity.renderFromObject +
                   0x108) == true) {
        Warning((FileLoc *)
                ((long)&(ppVar12->second).super_TransformedSceneEntity.super_SceneEntity + 0x88),
                "Animated world to texture transform not supported. Using start transform.");
      }
      pTVar4 = &ppVar2[uVar1].second;
      filename._M_dataplus._M_p =
           *(pointer *)&(pTVar4->super_TransformedSceneEntity).renderFromObject.startTransform.m;
      filename._M_string_length =
           *(size_type *)((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 8);
      filename.field_2._M_allocated_capacity =
           *(undefined8 *)
            *(Float (*) [4])((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 0x10);
      filename.field_2._8_8_ =
           *(undefined8 *)((long)&(pTVar4->super_TransformedSceneEntity).renderFromObject + 0x18);
      TextureParameterDictionary::TextureParameterDictionary
                (&texDict,(ParameterDictionary *)
                          ((long)&(ppVar12->second).super_TransformedSceneEntity.super_SceneEntity +
                          0x20),__return_storage_ptr__);
      name = &(ppVar12->second).texName;
      loc = (FileLoc *)
            ((long)&(ppVar12->second).super_TransformedSceneEntity.super_SceneEntity + 0x88);
      SpectrumTextureHandle::Create
                ((SpectrumTextureHandle *)&t,name,(Transform *)&filename,&texDict,Albedo,loc,
                 alloc_local,gpu_local);
      SpectrumTextureHandle::Create
                (&unboundedTex,name,(Transform *)&filename,&texDict,Unbounded,loc,alloc_local,
                 gpu_local);
      SpectrumTextureHandle::Create
                (&illumTex,name,(Transform *)&filename,&texDict,Illuminant,loc,alloc_local,gpu_local
                );
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               ::operator[](&__return_storage_ptr__->albedoSpectrumTextures,&ppVar12->first);
      (pmVar9->
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      ).bits = (uintptr_t)
               t.
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               ::operator[](&__return_storage_ptr__->unboundedSpectrumTextures,&ppVar12->first);
      (pmVar9->
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      ).bits = (uintptr_t)
               unboundedTex.
               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               ::operator[](&__return_storage_ptr__->illuminantSpectrumTextures,&ppVar12->first);
      (pmVar9->
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      ).bits = (uintptr_t)
               illumTex.
               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
    }
    if (LOGGING_LogLevel < 1) {
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
          ,0x381,"Done creating textures");
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&serialSpectrumTextures.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&parallelSpectrumTextures.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&serialFloatTextures.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&parallelFloatTextures.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seenSpectrumTextureFilenames._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seenFloatTextureFilenames._M_t);
    return __return_storage_ptr__;
  }
  ErrorExit<int&>("%d missing textures",&nMissingTextures);
}

Assistant:

NamedTextures ParsedScene::CreateTextures(Allocator alloc, bool gpu) const {
    NamedTextures textures;

    std::set<std::string> seenFloatTextureFilenames, seenSpectrumTextureFilenames;
    std::vector<size_t> parallelFloatTextures, serialFloatTextures;
    std::vector<size_t> parallelSpectrumTextures, serialSpectrumTextures;

    // Figure out which textures to load in parallel
    // Need to be careful since two textures can use the same image file;
    // we only want to load it once in that case...
    int nMissingTextures = 0;
    for (size_t i = 0; i < floatTextures.size(); ++i) {
        const auto &tex = floatTextures[i];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc,
                    "Animated world to texture transforms are not supported. "
                    "Using start transform.");

        if (tex.second.texName != "imagemap") {
            serialFloatTextures.push_back(i);
            continue;
        }

        std::string filename =
            ResolveFilename(tex.second.parameters.GetOneString("filename", ""));
        if (filename.empty())
            continue;
        if (!FileExists(filename)) {
            Error(&tex.second.loc, "%s: file not found.", filename);
            ++nMissingTextures;
        }

        if (seenFloatTextureFilenames.find(filename) == seenFloatTextureFilenames.end()) {
            seenFloatTextureFilenames.insert(filename);
            parallelFloatTextures.push_back(i);
        } else
            serialFloatTextures.push_back(i);
    }
    for (size_t i = 0; i < spectrumTextures.size(); ++i) {
        const auto &tex = spectrumTextures[i];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc,
                    "Animated world to texture transforms are not supported. "
                    "Using start transform.");

        if (tex.second.texName != "imagemap") {
            serialSpectrumTextures.push_back(i);
            continue;
        }

        std::string filename =
            ResolveFilename(tex.second.parameters.GetOneString("filename", ""));
        if (filename.empty())
            continue;
        if (!FileExists(filename)) {
            Error(&tex.second.loc, "%s: file not found.", filename);
            ++nMissingTextures;
        }

        if (seenSpectrumTextureFilenames.find(filename) ==
            seenSpectrumTextureFilenames.end()) {
            seenSpectrumTextureFilenames.insert(filename);
            parallelSpectrumTextures.push_back(i);
        } else
            serialSpectrumTextures.push_back(i);
    }

    if (nMissingTextures > 0)
        ErrorExit("%d missing textures", nMissingTextures);

    LOG_VERBOSE("Loading %d,%d textures in parallel, %d,%d serially",
                parallelFloatTextures.size(), parallelSpectrumTextures.size(),
                serialFloatTextures.size(), serialSpectrumTextures.size());

    // Load textures in parallel
    std::mutex mutex;

    ParallelFor(0, parallelFloatTextures.size(), [&](int64_t i) {
        const auto &tex = floatTextures[parallelFloatTextures[i]];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        // Pass nullptr for the textures, since they shouldn't be accessed
        // anyway.
        TextureParameterDictionary texDict(&tex.second.parameters, nullptr);
        FloatTextureHandle t = FloatTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, &tex.second.loc, alloc, gpu);
        std::lock_guard<std::mutex> lock(mutex);
        textures.floatTextures[tex.first] = t;
    });

    ParallelFor(0, parallelSpectrumTextures.size(), [&](int64_t i) {
        const auto &tex = spectrumTextures[parallelSpectrumTextures[i]];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        // nullptr for the textures, as above.
        TextureParameterDictionary texDict(&tex.second.parameters, nullptr);
        SpectrumTextureHandle albedoTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Albedo,
            &tex.second.loc, alloc, gpu);
        // These should be fast since they should hit the texture cache
        SpectrumTextureHandle unboundedTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Unbounded,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle illumTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Illuminant,
            &tex.second.loc, alloc, gpu);

        std::lock_guard<std::mutex> lock(mutex);
        textures.albedoSpectrumTextures[tex.first] = albedoTex;
        textures.unboundedSpectrumTextures[tex.first] = unboundedTex;
        textures.illuminantSpectrumTextures[tex.first] = illumTex;
    });

    LOG_VERBOSE("Loading serial textures");
    // And do the rest serially
    for (size_t index : serialFloatTextures) {
        const auto &tex = floatTextures[index];

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        TextureParameterDictionary texDict(&tex.second.parameters, &textures);
        FloatTextureHandle t = FloatTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, &tex.second.loc, alloc, gpu);
        textures.floatTextures[tex.first] = t;
    }
    for (size_t index : serialSpectrumTextures) {
        const auto &tex = spectrumTextures[index];

        if (tex.second.renderFromObject.IsAnimated())
            Warning(&tex.second.loc, "Animated world to texture transform not supported. "
                                     "Using start transform.");

        pbrt::Transform renderFromTexture = tex.second.renderFromObject.startTransform;
        TextureParameterDictionary texDict(&tex.second.parameters, &textures);
        SpectrumTextureHandle albedoTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Albedo,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle unboundedTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Unbounded,
            &tex.second.loc, alloc, gpu);
        SpectrumTextureHandle illumTex = SpectrumTextureHandle::Create(
            tex.second.texName, renderFromTexture, texDict, SpectrumType::Illuminant,
            &tex.second.loc, alloc, gpu);

        textures.albedoSpectrumTextures[tex.first] = albedoTex;
        textures.unboundedSpectrumTextures[tex.first] = unboundedTex;
        textures.illuminantSpectrumTextures[tex.first] = illumTex;
    }

    LOG_VERBOSE("Done creating textures");
    return textures;
}